

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O3

void __thiscall
HashTable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lablnet::FileMeta>
::HashTable(HashTable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lablnet::FileMeta>
            *this)

{
  TableItems<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lablnet::FileMeta>
  *pTVar1;
  int iVar2;
  undefined8 *puVar3;
  int i;
  uint uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  int i_1;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined4 local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined8 local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined4 local_38;
  
  this->capacity = 8;
  this->size = 0;
  this->PRIME = 7;
  puVar3 = (undefined8 *)operator_new__(0x5c8);
  *puVar3 = 8;
  lVar5 = 0;
  do {
    *(long *)((long)puVar3 + lVar5 + 8) = (long)puVar3 + lVar5 + 0x18;
    *(undefined8 *)((long)puVar3 + lVar5 + 0x10) = 0;
    *(undefined1 *)((long)puVar3 + lVar5 + 0x18) = 0;
    *(undefined4 *)((long)puVar3 + lVar5 + 0x28) = 2;
    *(long *)((long)puVar3 + lVar5 + 0x30) = (long)puVar3 + lVar5 + 0x40;
    *(undefined8 *)((long)puVar3 + lVar5 + 0x38) = 0;
    *(undefined1 *)((long)puVar3 + lVar5 + 0x40) = 0;
    *(long *)((long)puVar3 + lVar5 + 0x50) = (long)puVar3 + lVar5 + 0x60;
    *(undefined8 *)((long)puVar3 + lVar5 + 0x58) = 0;
    *(undefined1 *)((long)puVar3 + lVar5 + 0x60) = 0;
    *(long *)((long)puVar3 + lVar5 + 0x78) = (long)puVar3 + lVar5 + 0x88;
    *(undefined8 *)((long)puVar3 + lVar5 + 0x80) = 0;
    *(undefined1 *)((long)puVar3 + lVar5 + 0x88) = 0;
    *(long *)((long)puVar3 + lVar5 + 0x98) = (long)puVar3 + lVar5 + 0xa8;
    *(undefined8 *)((long)puVar3 + lVar5 + 0xa0) = 0;
    *(undefined1 *)((long)puVar3 + lVar5 + 0xa8) = 0;
    *(undefined4 *)((long)puVar3 + lVar5 + 0xb8) = 0xffffffff;
    lVar5 = lVar5 + 0xb8;
  } while (lVar5 != 0x5c0);
  this->table = (TableItems<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lablnet::FileMeta>
                 *)(puVar3 + 1);
  uVar4 = 8;
  iVar6 = -6;
  do {
    uVar7 = 2;
    while ((int)((ulong)uVar4 % uVar7) != 0) {
      iVar2 = (int)uVar7;
      uVar7 = (ulong)(iVar2 + 1);
      if (iVar6 + iVar2 == 1) goto LAB_001035b2;
    }
    uVar4 = uVar4 - 1;
    iVar6 = iVar6 + 1;
  } while (uVar4 != 2);
  uVar4 = 2;
LAB_001035b2:
  this->PRIME = uVar4;
  lVar5 = 0x70;
  lVar8 = 0;
  do {
    memset(&local_e8.field_2,0,0xa8);
    local_e8._M_string_length = 0;
    local_c8 = 2;
    local_c0.field_2._M_local_buf[0] = '\0';
    local_a0.field_2._M_local_buf[0] = '\0';
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    local_78.field_2._M_local_buf[0] = '\0';
    local_58.field_2._M_local_buf[0] = '\0';
    local_38 = 0xffffffff;
    pTVar1 = this->table;
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)pTVar1 + lVar5 + -0x70),&local_e8);
    *(undefined4 *)((long)pTVar1 + lVar5 + -0x50) = local_c8;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)pTVar1 + lVar5 + -0x48),&local_c0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)pTVar1 + lVar5 + -0x28),&local_a0);
    *(undefined8 *)((long)pTVar1 + lVar5 + -8) = local_80;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&(pTVar1->key)._M_dataplus._M_p + lVar5),&local_78);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&(pTVar1->value).type + lVar5),&local_58);
    *(undefined4 *)((long)&(pTVar1->value).name.field_2 + lVar5 + 8) = local_38;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                               local_78.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,
                      CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                               local_a0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,
                      CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                               local_c0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    lVar8 = lVar8 + 1;
    lVar5 = lVar5 + 0xb8;
  } while (lVar8 < this->capacity);
  return;
}

Assistant:

HashTable() {
        this->table = new TableItems<K, V>[capacity];
        this->PRIME = lablnet::findLeastPrime(this->capacity);
        for (int i = 0; i< this->capacity; i++) {
            this->table[i] = TableItems<K, V>();
        }
    }